

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestRunner.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_43984::TestTestRunnerFixtureTestRunnerRunsTestsThatPassPredicate::RunImpl
          (TestTestRunnerFixtureTestRunnerRunsTestsThatPassPredicate *this)

{
  TestDetails *details;
  TestRunnerFixtureTestRunnerRunsTestsThatPassPredicateHelper fixtureHelper;
  TestRunnerFixtureTestRunnerRunsTestsThatPassPredicateHelper local_890;
  
  details = &(this->super_Test).m_details;
  TestRunnerFixture::TestRunnerFixture(&local_890.super_TestRunnerFixture);
  local_890.m_details = details;
  UnitTest::
  ExecuteTest<(anonymous_namespace)::TestRunnerFixtureTestRunnerRunsTestsThatPassPredicateHelper>
            (&local_890,details);
  UnitTest::TestRunner::~TestRunner(&local_890.super_TestRunnerFixture.runner);
  UnitTest::TestReporter::~TestReporter((TestReporter *)&local_890);
  return;
}

Assistant:

TEST_FIXTURE(TestRunnerFixture, TestRunnerRunsTestsThatPassPredicate)
{
    Test should_run("goodtest");
    list.Add(&should_run);

    Test should_not_run("badtest");
	list.Add(&should_not_run);
 
	runner.RunTestsIf(list, NULL, RunTestIfNameIs("goodtest"), 0);
	CHECK_EQUAL(1, reporter.testRunCount);
    CHECK_EQUAL("goodtest", reporter.lastStartedTest);
}